

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::SubroutineFunctionSet::SubroutineFunctionSet
          (SubroutineFunctionSet *this,SubroutineFunctionSet *param_1)

{
  SubroutineFunction *pSVar1;
  pointer pcVar2;
  SubroutineFunction *this_00;
  SubroutineFunction *pSVar3;
  long lVar4;
  
  lVar4 = (long)(param_1->fn).
                super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(param_1->fn).
                super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (this->fn).
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fn).
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fn).
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = std::
            _Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
            ::_M_allocate((_Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                           *)((lVar4 >> 3) * 0xf83e0f83e0f83e1),(size_t)param_1);
  (this->fn).
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ._M_impl.super__Vector_impl_data._M_start = this_00;
  (this->fn).
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ._M_impl.super__Vector_impl_data._M_finish = this_00;
  (this->fn).
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar4 + (long)this_00);
  pSVar1 = (param_1->fn).
           super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar3 = (param_1->fn).
                super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar3 != pSVar1; pSVar3 = pSVar3 + 1) {
    SubroutineFunction::SubroutineFunction(this_00,pSVar3);
    this_00 = this_00 + 1;
  }
  (this->fn).
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ._M_impl.super__Vector_impl_data._M_finish = this_00;
  (this->typeName)._M_dataplus._M_p = (pointer)&(this->typeName).field_2;
  pcVar2 = (param_1->typeName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->typeName,pcVar2,pcVar2 + (param_1->typeName)._M_string_length);
  return;
}

Assistant:

SubroutineFunctionSet(UniformValueGenerator& generator, size_t count = 0) : fn(count, SubroutineFunction(generator))
	{
	}